

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

void apx_socketServer_start_tcp_server(apx_socketServer_t *self,uint16_t tcp_port,char *tag)

{
  msocket_server_t *pmVar1;
  char *pcVar2;
  msocket_handler_t server_handler;
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (self != (apx_socketServer_t *)0x0) {
    self->tcp_port = tcp_port;
    if (tag != (char *)0x0) {
      pcVar2 = strdup(tag);
      self->tcp_connection_tag = pcVar2;
    }
    uStack_40 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = apx_socketServer_tcp_accept;
    pmVar1 = &self->tcp_server;
    msocket_server_create(pmVar1,2,0);
    msocket_server_disable_cleanup(pmVar1);
    msocket_server_set_handler(pmVar1,&local_48,self);
    msocket_server_start(pmVar1,0,0,self->tcp_port);
    self->is_tcp_server_started = true;
    printf("Listening on TCP port %d\n",(ulong)self->tcp_port);
  }
  return;
}

Assistant:

void apx_socketServer_start_tcp_server(apx_socketServer_t *self, uint16_t tcp_port, const char *tag)
{
   if (self != 0)
   {
      //char msg[80];
      msocket_handler_t server_handler;
      self->tcp_port = tcp_port;
      if (tag != 0)
      {
         self->tcp_connection_tag = STRDUP(tag);
      }
      memset(&server_handler,0,sizeof(server_handler));
#ifndef UNIT_TEST
      server_handler.tcp_accept = apx_socketServer_tcp_accept;
#endif
      msocket_server_create(&self->tcp_server, AF_INET, NULL);
      msocket_server_disable_cleanup(&self->tcp_server); //we will use our own garbage collector
      msocket_server_sethandler(&self->tcp_server, &server_handler, self);
      msocket_server_start(&self->tcp_server, NULL, 0, self->tcp_port);
      self->is_tcp_server_started = true;
      printf("Listening on TCP port %d\n", (int) self->tcp_port);
      //sprintf(msg, "Listening on TCP port %d", (int) self->tcpPort);
      //apx_server_logEvent(self->parent, APX_LOG_LEVEL_INFO, APX_SOCKET_SERVER_LABEL, &msg[0]);

   }
}